

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderDoubleAttribute(ImfHeader *hdr,char *name,double *value)

{
  TypedAttribute<double> *this;
  double *pdVar1;
  Header *in_RDX;
  ImfHeader *in_RDI;
  exception *e;
  char *in_stack_ffffffffffffffd8;
  
  anon_unknown.dwarf_70604::header(in_RDI);
  this = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<double>>
                   (in_RDX,in_stack_ffffffffffffffd8);
  pdVar1 = Imf_3_4::TypedAttribute<double>::value(this);
  *(double *)&(in_RDX->_map)._M_t._M_impl = *pdVar1;
  return 1;
}

Assistant:

int
ImfHeaderDoubleAttribute (
    const ImfHeader* hdr, const char name[], double* value)
{
    try
    {
        *value = header (hdr)
                     ->typedAttribute<
                         OPENEXR_IMF_INTERNAL_NAMESPACE::DoubleAttribute> (name)
                     .value ();

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}